

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# forkSort.c
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  bool local_91;
  __ssize_t local_90;
  ssize_t ret2;
  ssize_t ret1;
  size_t length2;
  size_t length1;
  char *line2;
  char *line1;
  FILE *file2;
  FILE *file1;
  int p2;
  int p1;
  int pipes [4] [2];
  char **readString;
  char **ppcStack_18;
  int counter;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  fileName = *argv;
  readString._4_4_ = 0;
  ppcStack_18 = argv;
  argv_local._0_4_ = argc;
  if (argc != 1) {
    fprintf(_stderr,"USAGE:\t%s\n",fileName);
    exit(1);
  }
  pipes[3] = (int  [2])get_input((int *)((long)&readString + 4));
  if (readString._4_4_ == 1) {
    fprintf(_stdout,"%s",*(char **)pipes[3]);
    free(*(void **)pipes[3]);
    free((void *)pipes[3]);
    fprintf(_stderr,"%s Success\n",fileName);
    exit(0);
  }
  iVar1 = pipe(&p2);
  if ((((iVar1 != -1) && (iVar1 = pipe(pipes[1]), iVar1 != -1)) &&
      (iVar1 = pipe(pipes[0]), iVar1 != -1)) && (iVar1 = pipe(pipes[2]), iVar1 != -1)) {
    create_child_process((int (*) [2])&p2,(int *)((long)&file1 + 4),(int *)&file1);
    close(p2);
    close(pipes[0][0]);
    close(pipes[1][1]);
    close(pipes[2][1]);
    write_to_child_process((int (*) [2])&p2,readString._4_4_,(char **)pipes[3]);
    close(p1);
    close(pipes[0][1]);
    wait_for_child_process(file1._4_4_,(int)file1);
    file2 = (FILE *)fdopen(pipes[1][0],"r");
    line1 = (char *)fdopen(pipes[2][0],"r");
    line2 = (char *)0x0;
    length1 = 0;
    length2 = 0;
    ret1 = 0;
    ret2 = getline(&line2,&length2,(FILE *)file2);
    local_90 = getline((char **)&length1,(size_t *)&ret1,(FILE *)line1);
    do {
      iVar1 = strcmp(line2,(char *)length1);
      if (iVar1 < 0) {
        fprintf(_stdout,"%s",line2);
        ret2 = getline(&line2,&length2,(FILE *)file2);
      }
      else {
        fprintf(_stdout,"%s",length1);
        local_90 = getline((char **)&length1,(size_t *)&ret1,(FILE *)line1);
      }
      local_91 = ret2 != -1 && local_90 != -1;
    } while (local_91);
    while (ret2 != -1) {
      fprintf(_stdout,"%s",line2);
      ret2 = getline(&line2,&length2,(FILE *)file2);
    }
    while (local_90 != -1) {
      fprintf(_stdout,"%s",length1);
      local_90 = getline((char **)&length1,(size_t *)&ret1,(FILE *)line1);
    }
    free(line2);
    free((void *)length1);
    fclose((FILE *)file2);
    fclose((FILE *)line1);
    fprintf(_stderr,"%s Success\n",fileName);
    exit(0);
  }
  fprintf(_stderr,"%s ERROR: Pipe-Error\n",fileName);
  exit(1);
}

Assistant:

int main(int argc, char *argv[])
{
	fileName = argv[0];

	int counter = 0;

	if (argc != 1)
	{
		USAGE();
	}

	char **readString = get_input(&counter);

	if (counter == 1)
	{
		fprintf(stdout, "%s", readString[0]);

		free(readString[0]);
		free(readString);

		SUCCESS_EXIT();
	}

	int pipes[4][2];

	if (pipe(pipes[PIPE_1_WRITE]) == -1 || pipe(pipes[PIPE_1_READ]) == -1 || pipe(pipes[PIPE_2_WRITE]) == -1 || pipe(pipes[PIPE_2_READ]) == -1)
	{
		ERROR_EXIT("Pipe-Error");
	}

	int p1, p2; //first child process

	create_child_process(pipes, &p1, &p2);

	close(pipes[PIPE_1_WRITE][READ]);
	close(pipes[PIPE_2_WRITE][READ]);
	close(pipes[PIPE_1_READ][WRITE]);
	close(pipes[PIPE_2_READ][WRITE]);

	write_to_child_process(pipes,counter, readString);

	close(pipes[PIPE_1_WRITE][WRITE]);
	close(pipes[PIPE_2_WRITE][WRITE]);

    wait_for_child_process(p1, p2);

	FILE *file1 = fdopen(pipes[PIPE_1_READ][READ], "r"); //opens pipe as file
	FILE *file2 = fdopen(pipes[PIPE_2_READ][READ], "r"); //opens pipe as file

	
	char *line1 = NULL;
	char *line2 = NULL;
	size_t length1 = 0;
	size_t length2 = 0;
	ssize_t ret1 = getline(&line1, &length1, file1);
	ssize_t ret2 = getline(&line2, &length2, file2);

	// fetch one line from both
	// compare
	// print smaller and fetch a new one from that one
	// repeat till out of lines
	do
	{
		if (strcmp(line1, line2) < 0)
		{
			fprintf(stdout, "%s", line1);
			ret1 = getline(&line1, &length1, file1);
		}
		else{
			fprintf(stdout, "%s", line2);
			ret2 = getline(&line2, &length2, file2);
		}

	} while (ret1 != -1 && ret2 != -1);

	// if lines remain print them all
	while(ret1 != -1){
		fprintf(stdout,"%s", line1);
				
		ret1 = getline(&line1, &length1, file1);
	}

	while(ret2 != -1){
		fprintf(stdout,"%s", line2);
				
		ret2 = getline(&line2, &length2, file2);
	}

	free(line1);
	free(line2);

	fclose(file1);
	fclose(file2);


	SUCCESS_EXIT();
}